

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxForceFeedback.cpp
# Opt level: O0

void __thiscall OIS::LinuxForceFeedback::_stop(LinuxForceFeedback *this,int handle)

{
  ssize_t sVar1;
  char *file;
  long in_RDI;
  input_event stop;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  undefined1 local_28 [4];
  OIS_ERROR in_stack_ffffffffffffffdc;
  Exception *in_stack_ffffffffffffffe0;
  
  sVar1 = write(*(int *)(in_RDI + 0x70),local_28,0x18);
  if (sVar1 != 0x18) {
    file = (char *)__cxa_allocate_exception(0x20);
    Exception::Exception
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc,file);
    __cxa_throw(file,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

void LinuxForceFeedback::_stop(int handle)
{
	struct input_event stop;

	stop.type  = EV_FF;
	stop.code  = handle;
	stop.value = 0;

#if(OIS_LINUX_JOYFF_DEBUG > 1)
	cout << endl
		 << "LinuxForceFeedback(" << mJoyStick
		 << ") : Stopping effect with handle " << handle << endl;
#endif

	if(write(mJoyStick, &stop, sizeof(stop)) != sizeof(stop))
	{
		OIS_EXCEPT(E_General, "Unknown error stopping effect->..");
	}
}